

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

XYZ pbrt::Mul<pbrt::XYZ,3,pbrt::XYZ>(SquareMatrix<3> *m,XYZ *v)

{
  undefined1 auVar1 [16];
  XYZ XVar2;
  Float *pFVar3;
  float *pfVar4;
  XYZ *in_RSI;
  int j;
  int i;
  XYZ result;
  int in_stack_ffffffffffffffac;
  Float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  span<const_float> local_38;
  int local_28;
  int local_24;
  XYZ *local_20;
  XYZ local_c;
  
  local_20 = in_RSI;
  XYZ::XYZ(&local_c);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pFVar3 = XYZ::operator[](&local_c,local_24);
    *pFVar3 = 0.0;
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      local_38 = SquareMatrix<3>::operator[]
                           ((SquareMatrix<3> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
      pfVar4 = pstd::span<const_float>::operator[](&local_38,(long)local_28);
      in_stack_ffffffffffffffb4 = *pfVar4;
      in_stack_ffffffffffffffb0 = XYZ::operator[](local_20,local_28);
      pFVar3 = XYZ::operator[](&local_c,local_24);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffb0),
                               ZEXT416((uint)in_stack_ffffffffffffffb4),ZEXT416((uint)*pFVar3));
      *pFVar3 = auVar1._0_4_;
    }
  }
  XVar2.Z = local_c.Z;
  XVar2.X = local_c.X;
  XVar2.Y = local_c.Y;
  return XVar2;
}

Assistant:

PBRT_CPU_GPU inline Tresult Mul(const SquareMatrix<N> &m, const T &v) {
    Tresult result;
    for (int i = 0; i < N; ++i) {
        result[i] = 0;
        for (int j = 0; j < N; ++j)
            result[i] += m[i][j] * v[j];
    }
    return result;
}